

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O2

int WriteOutput(sunrealtype t,N_Vector y,N_Vector e,sunrealtype ec,int screenfile,FILE *YFID,
               FILE *EFID)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer();
  puVar3 = (undefined8 *)N_VGetArrayPointer(e);
  if (screenfile == 0) {
    iVar2 = printf("%0.4e %14.6e %14.6e %14.6e %14.6e %14.6e\n",t,*puVar1,puVar1[1],*puVar3,
                   puVar3[1],ec);
    return iVar2;
  }
  if (EFID == (FILE *)0x0 || YFID == (FILE *)0x0) {
    return CONCAT31((int3)((ulong)puVar3 >> 8),YFID == (FILE *)0x0);
  }
  fprintf((FILE *)YFID,"%24.16e %24.16e %24.16e\n",t,*puVar1,puVar1[1]);
  iVar2 = fprintf((FILE *)EFID,"%24.16e %24.16e %24.16e %24.16e\n",t,*puVar3,puVar3[1],ec);
  return iVar2;
}

Assistant:

static int WriteOutput(sunrealtype t, N_Vector y, N_Vector e, sunrealtype ec,
                       int screenfile, FILE* YFID, FILE* EFID)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  sunrealtype* edata = N_VGetArrayPointer(e);

  if (screenfile == 0)
  {
    /* output solution and error to screen */
    printf("%0.4" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
           " %14.6" ESYM "\n",
           t, ydata[0], ydata[1], edata[0], edata[1], ec);
  }
  else
  {
    /* check file pointers */
    if (YFID == NULL || EFID == NULL) { return (1); }

    /* output solution to disk */
    fprintf(YFID, "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM "\n", t, ydata[0],
            ydata[1]);

    /* output error to disk */
    fprintf(EFID, "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM "\n",
            t, edata[0], edata[1], ec);
  }

  return (0);
}